

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall
ast::BinaryOp::BinaryOp(BinaryOp *this,Token *t,int p,int a,int line,NodeType node_type)

{
  Token local_60;
  
  token::Token::Token(&local_60,t);
  Op::Op(&this->super_Op,&local_60,p,a,line,node_type);
  token::Token::~Token(&local_60);
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR__BinaryOp_00122908;
  this->RightOp = (Expr *)0x0;
  this->LeftOp = (Expr *)0x0;
  return;
}

Assistant:

BinaryOp(Token t, int p, int a, int line, NodeType node_type)
        :Op(t, p, a, line, node_type), RightOp{nullptr}, LeftOp{nullptr} {}